

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

int mp_check_ext_data_test(int8_t type,char *data,uint32_t len)

{
  long lVar1;
  uint uVar2;
  uint32_t uVar3;
  long lVar4;
  bool bVar5;
  
  uVar2 = 1;
  if (type == 'B') {
    bVar5 = len != 0;
    if ((bVar5) && ((byte)*data == len)) {
      lVar1 = 1;
      uVar3 = len;
      do {
        lVar4 = lVar1;
        if (uVar3 == 1) break;
        uVar3 = uVar3 - 1;
        lVar1 = lVar4 + 1;
      } while (uVar3 == (byte)data[lVar4]);
      bVar5 = (uint)lVar4 < len;
    }
    uVar2 = (uint)bVar5;
  }
  return uVar2;
}

Assistant:

int
mp_check_ext_data_test(int8_t type, const char *data, uint32_t len)
{
	if (type != 0x42)
		return 1;
	for (uint32_t i = 0; i < len; i++) {
		if ((unsigned char)data[i] != len - i)
			return 1;
	}
	return 0;
}